

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

string * __thiscall
deqp::egl::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_198;
  size_t ndx;
  ostringstream stream;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ndx);
  for (local_198 = 0;
      sVar1 = std::
              vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
              ::size((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                      *)this), local_198 < sVar1; local_198 = local_198 + 1) {
    pvVar2 = std::
             vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
             ::operator[]((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                           *)this,local_198);
    if (*pvVar2 == DRAWTYPE_GLES2_RENDER) {
      std::operator<<((ostream *)&ndx,"render");
    }
    else {
      pvVar2 = std::
               vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
               ::operator[]((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                             *)this,local_198);
      if (*pvVar2 == DRAWTYPE_GLES2_CLEAR) {
        std::operator<<((ostream *)&ndx,"clear");
      }
    }
    sVar1 = std::
            vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
            ::size((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                    *)this);
    if (local_198 < sVar1 - 1) {
      std::operator<<((ostream *)&ndx,"_");
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ndx);
  return __return_storage_ptr__;
}

Assistant:

string generateTestName (const vector<DrawType>& frameDrawType)
{
	std::ostringstream stream;

	for (size_t ndx = 0; ndx < frameDrawType.size(); ndx++)
	{
		if (frameDrawType[ndx] == DRAWTYPE_GLES2_RENDER)
			stream << "render";
		else if (frameDrawType[ndx] == DRAWTYPE_GLES2_CLEAR)
			stream << "clear";
		else
			DE_ASSERT(false);

		if (ndx < frameDrawType.size()-1)
			stream << "_";
	}

	return stream.str();
}